

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

int secp256k1_ecmult_pippenger_batch
              (secp256k1_callback *error_callback,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,
              size_t n_points,size_t cb_offset)

{
  int *piVar1;
  long lVar2;
  uint uVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  uint32_t uVar8;
  size_t checkpoint;
  secp256k1_ge *p1;
  secp256k1_scalar *s1;
  ulong *puVar9;
  void *pvVar10;
  ulong uVar11;
  secp256k1_gej *b;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  secp256k1_fe *rzr;
  secp256k1_gej *b_00;
  uint uVar18;
  secp256k1_ge *psVar19;
  secp256k1_ge *psVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  secp256k1_scalar *psVar24;
  ulong uVar25;
  long lVar26;
  bool bVar27;
  byte bVar28;
  ulong uStack_190;
  long local_158;
  secp256k1_gej running_sum;
  
  bVar28 = 0;
  checkpoint = secp256k1_scratch_checkpoint(error_callback,scratch);
  secp256k1_gej_set_infinity(r);
  if (inp_g_sc == (secp256k1_scalar *)0x0 && n_points == 0) {
LAB_0011595e:
    iVar6 = 1;
  }
  else {
    lVar17 = n_points * 2 + 2;
    if (n_points < 2) {
      uStack_190 = 1;
    }
    else if (n_points < 5) {
      uStack_190 = 2;
    }
    else if (n_points < 0x15) {
      uStack_190 = 3;
    }
    else if (n_points < 0x3a) {
      uStack_190 = 4;
    }
    else if (n_points < 0x89) {
      uStack_190 = 5;
    }
    else if (n_points < 0xec) {
      uStack_190 = 6;
    }
    else if (n_points < 0x4ed) {
      uStack_190 = 7;
    }
    else if (n_points < 0x1145) {
      uStack_190 = 9;
    }
    else if (n_points < 0x1ec9) {
      uStack_190 = 10;
    }
    else {
      uStack_190 = (ulong)(0xc - (n_points < 0x3eb3));
    }
    p1 = (secp256k1_ge *)secp256k1_scratch_alloc(error_callback,scratch,lVar17 * 0x68);
    s1 = (secp256k1_scalar *)secp256k1_scratch_alloc(error_callback,scratch,lVar17 * 4);
    puVar9 = (ulong *)secp256k1_scratch_alloc(error_callback,scratch,0x10);
    if ((puVar9 != (ulong *)0x0 && s1 != (secp256k1_scalar *)0x0) && p1 != (secp256k1_ge *)0x0) {
      pvVar10 = secp256k1_scratch_alloc(error_callback,scratch,lVar17 * 0x10);
      puVar9[1] = (ulong)pvVar10;
      uVar14 = (uint)uStack_190 + 1;
      bVar5 = 0x7f / (byte)uVar14;
      uVar11 = (ulong)bVar5;
      uVar16 = (ulong)(bVar5 + 1);
      pvVar10 = secp256k1_scratch_alloc(error_callback,scratch,lVar17 * 4 * uVar16);
      *puVar9 = (ulong)pvVar10;
      bVar4 = (byte)uStack_190;
      b = (secp256k1_gej *)secp256k1_scratch_alloc(error_callback,scratch,0x98L << (bVar4 & 0x3f));
      if (((puVar9[1] != 0) && (*puVar9 != 0)) && (b != (secp256k1_gej *)0x0)) {
        if (inp_g_sc == (secp256k1_scalar *)0x0) {
          lVar17 = 0;
        }
        else {
          *s1 = *inp_g_sc;
          psVar19 = &secp256k1_ge_const_g;
          psVar20 = p1;
          for (lVar17 = 0xd; lVar17 != 0; lVar17 = lVar17 + -1) {
            (psVar20->x).n[0] = (psVar19->x).n[0];
            psVar19 = (secp256k1_ge *)((long)psVar19 + ((ulong)bVar28 * -2 + 1) * 8);
            psVar20 = (secp256k1_ge *)((long)psVar20 + (ulong)bVar28 * -0x10 + 8);
          }
          secp256k1_ecmult_endo_split(s1,s1 + 1,p1,p1 + 1);
          lVar17 = 2;
        }
        psVar24 = s1 + lVar17;
        psVar19 = p1 + lVar17;
        while (bVar27 = n_points != 0, n_points = n_points - 1, bVar27) {
          iVar6 = (*cb)(psVar24,psVar19,cb_offset,cbdata);
          if (iVar6 == 0) goto LAB_00115b65;
          secp256k1_ecmult_endo_split(psVar24,psVar24 + 1,psVar19,psVar19 + 1);
          lVar17 = lVar17 + 2;
          psVar24 = psVar24 + 2;
          psVar19 = psVar19 + 2;
          cb_offset = cb_offset + 1;
        }
        uVar15 = 0x80 - uVar14 * bVar5;
        iVar6 = -2 << (bVar4 & 0x1f);
        local_158 = 0;
        for (lVar21 = 0; lVar17 != lVar21; lVar21 = lVar21 + 1) {
          psVar24 = s1 + lVar21;
          iVar7 = secp256k1_scalar_is_zero(psVar24);
          if ((iVar7 == 0) && (iVar7 = secp256k1_ge_is_infinity(p1 + lVar21), iVar7 == 0)) {
            *(long *)(puVar9[1] + 8 + local_158 * 0x10) = lVar21;
            uVar12 = *puVar9;
            piVar1 = (int *)(uVar12 + local_158 * uVar16 * 4);
            iVar7 = secp256k1_scalar_is_zero(psVar24);
            if (iVar7 == 0) {
              secp256k1_scalar_verify(psVar24);
              uVar23 = ~*psVar24 & 1;
              uVar8 = secp256k1_scalar_get_bits_var(psVar24,0,uVar14);
              *piVar1 = uVar8 + uVar23;
              uVar18 = bVar5 * uVar14;
              lVar26 = 0;
              uVar25 = uVar11;
              while (0 < (long)(uVar11 + lVar26)) {
                uVar3 = uVar14;
                if (lVar26 == 0) {
                  uVar3 = uVar15;
                }
                uVar8 = secp256k1_scalar_get_bits_var(psVar24,uVar18,uVar3);
                if (uVar8 != 0) break;
                *(undefined4 *)
                 ((ulong)((bVar5 + 1) * 4) * local_158 + uVar12 + (uint)bVar5 * 4 + lVar26 * 4) = 0;
                uVar18 = uVar18 + ~(uint)uStack_190;
                uVar25 = uVar25 - 1;
                lVar26 = lVar26 + -1;
              }
              uVar12 = 1;
              uVar18 = uVar14;
              while( true ) {
                uVar13 = 0;
                if (0 < (long)uVar25) {
                  uVar13 = uVar25;
                }
                if (uVar12 - uVar13 == 1) break;
                uVar3 = uVar14;
                if (uVar11 == uVar12) {
                  uVar3 = uVar15;
                }
                uVar8 = secp256k1_scalar_get_bits_var(psVar24,uVar18,uVar3);
                if ((uVar8 & 1) == 0) {
                  piVar1[uVar12 - 1] = piVar1[uVar12 - 1] + iVar6;
                  uVar8 = uVar8 | 1;
                }
                piVar1[uVar12] = uVar8;
                if (1 < uVar12) {
                  if (piVar1[uVar12 - 1] == -1) {
                    if (0 < piVar1[uVar12 - 2]) {
                      iVar7 = piVar1[uVar12 - 2] + iVar6;
                      goto LAB_00115e4d;
                    }
                  }
                  else if ((piVar1[uVar12 - 1] == 1) && (piVar1[uVar12 - 2] < 0)) {
                    iVar7 = piVar1[uVar12 - 2] + (2 << (bVar4 & 0x1f));
LAB_00115e4d:
                    piVar1[uVar12 - 2] = iVar7;
                    piVar1[uVar12 - 1] = 0;
                  }
                }
                uVar12 = uVar12 + 1;
                uVar18 = uVar18 + uVar14;
              }
            }
            else {
              for (uVar12 = 0; uVar16 != uVar12; uVar12 = uVar12 + 1) {
                piVar1[uVar12] = 0;
              }
              uVar23 = 0;
            }
            *(uint *)(puVar9[1] + local_158 * 0x10) = uVar23;
            local_158 = local_158 + 1;
          }
        }
        secp256k1_gej_set_infinity(r);
        if (local_158 != 0) {
          lVar17 = 1L << (bVar4 & 0x3f);
          rzr = (secp256k1_fe *)(uStack_190 + 1);
          uVar16 = 0x7f / (ulong)rzr;
          while (iVar6 = (int)uVar11, -1 < iVar6) {
            for (lVar21 = 0; lVar17 * 0x98 != lVar21; lVar21 = lVar21 + 0x98) {
              secp256k1_gej_set_infinity((secp256k1_gej *)((long)(b->x).n + lVar21));
            }
            lVar22 = uVar11 << 2;
            lVar21 = 8;
            lVar26 = local_158;
            while (bVar27 = lVar26 != 0, lVar26 = lVar26 + -1, uVar11 = uStack_190, bVar27) {
              rzr = (secp256k1_fe *)*puVar9;
              uVar14 = *(uint *)((long)rzr->n + lVar22);
              lVar2 = *(long *)(puVar9[1] + lVar21);
              if ((iVar6 == 0) && (*(int *)((puVar9[1] - 8) + lVar21) != 0)) {
                secp256k1_ge_neg((secp256k1_ge *)&running_sum,p1 + lVar2);
                rzr = (secp256k1_fe *)0x0;
                secp256k1_gej_add_ge_var(b,b,(secp256k1_ge *)&running_sum,(secp256k1_fe *)0x0);
              }
              if ((int)uVar14 < 1) {
                if ((int)uVar14 < 0) {
                  uVar14 = ~uVar14;
                  secp256k1_ge_neg((secp256k1_ge *)&running_sum,p1 + lVar2);
                  b_00 = &running_sum;
                  goto LAB_00115fa9;
                }
              }
              else {
                uVar14 = uVar14 - 1;
                b_00 = (secp256k1_gej *)(p1 + lVar2);
LAB_00115fa9:
                rzr = (secp256k1_fe *)0x0;
                secp256k1_gej_add_ge_var
                          (b + (uVar14 >> 1),b + (uVar14 >> 1),(secp256k1_ge *)b_00,
                           (secp256k1_fe *)0x0);
              }
              lVar21 = lVar21 + 0x10;
              lVar22 = lVar22 + uVar16 * 4 + 4;
            }
            while ((int)uVar11 != 0) {
              secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
              uVar11 = (ulong)((int)uVar11 - 1);
            }
            secp256k1_gej_set_infinity(&running_sum);
            lVar21 = lVar17;
            while (1 < lVar21) {
              lVar21 = lVar21 + -1;
              secp256k1_gej_add_var(&running_sum,&running_sum,b + ((uint)lVar21 & 0x7fffffff),rzr);
              secp256k1_gej_add_var(r,r,&running_sum,rzr);
            }
            secp256k1_gej_add_var(&running_sum,&running_sum,b,rzr);
            secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
            secp256k1_gej_add_var(r,r,&running_sum,rzr);
            uVar11 = (ulong)(iVar6 - 1);
          }
        }
        secp256k1_scratch_apply_checkpoint(error_callback,scratch,checkpoint);
        goto LAB_0011595e;
      }
    }
LAB_00115b65:
    secp256k1_scratch_apply_checkpoint(error_callback,scratch,checkpoint);
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

static int secp256k1_ecmult_pippenger_batch(const secp256k1_callback* error_callback, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n_points, size_t cb_offset) {
    const size_t scratch_checkpoint = secp256k1_scratch_checkpoint(error_callback, scratch);
    /* Use 2(n+1) with the endomorphism, when calculating batch
     * sizes. The reason for +1 is that we add the G scalar to the list of
     * other scalars. */
    size_t entries = 2*n_points + 2;
    secp256k1_ge *points;
    secp256k1_scalar *scalars;
    secp256k1_gej *buckets;
    struct secp256k1_pippenger_state *state_space;
    size_t idx = 0;
    size_t point_idx = 0;
    int bucket_window;

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n_points == 0) {
        return 1;
    }
    bucket_window = secp256k1_pippenger_bucket_window(n_points);

    /* We allocate PIPPENGER_SCRATCH_OBJECTS objects on the scratch space. If
     * these allocations change, make sure to update the
     * PIPPENGER_SCRATCH_OBJECTS constant and pippenger_scratch_size
     * accordingly. */
    points = (secp256k1_ge *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*points));
    scalars = (secp256k1_scalar *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*scalars));
    state_space = (struct secp256k1_pippenger_state *) secp256k1_scratch_alloc(error_callback, scratch, sizeof(*state_space));
    if (points == NULL || scalars == NULL || state_space == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }
    state_space->ps = (struct secp256k1_pippenger_point_state *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*state_space->ps));
    state_space->wnaf_na = (int *) secp256k1_scratch_alloc(error_callback, scratch, entries*(WNAF_SIZE(bucket_window+1)) * sizeof(int));
    buckets = (secp256k1_gej *) secp256k1_scratch_alloc(error_callback, scratch, ((size_t)1 << bucket_window) * sizeof(*buckets));
    if (state_space->ps == NULL || state_space->wnaf_na == NULL || buckets == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }

    if (inp_g_sc != NULL) {
        scalars[0] = *inp_g_sc;
        points[0] = secp256k1_ge_const_g;
        idx++;
        secp256k1_ecmult_endo_split(&scalars[0], &scalars[1], &points[0], &points[1]);
        idx++;
    }

    while (point_idx < n_points) {
        if (!cb(&scalars[idx], &points[idx], point_idx + cb_offset, cbdata)) {
            secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
            return 0;
        }
        idx++;
        secp256k1_ecmult_endo_split(&scalars[idx - 1], &scalars[idx], &points[idx - 1], &points[idx]);
        idx++;
        point_idx++;
    }

    secp256k1_ecmult_pippenger_wnaf(buckets, bucket_window, state_space, r, scalars, points, idx);
    secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
    return 1;
}